

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

object * findProc(void)

{
  long lVar1;
  object *poVar2;
  object *poVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  object *poVar7;
  object *poVar8;
  bool bVar9;
  
  poVar2 = guard;
  poVar8 = topScope;
  uVar5 = 0xffffffffffffffff;
  do {
    lVar1 = uVar5 + 1;
    uVar5 = uVar5 + 1;
  } while (idName[lVar1] != '\0');
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    uVar6 = 1;
    if (1 < (int)uVar5) {
      uVar6 = uVar5 & 0xffffffff;
    }
    uVar5 = 0;
    do {
      poVar2->name[uVar5] = idName[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  poVar2->name[uVar5] = '\0';
  poVar3 = universe;
  poVar2 = guard;
  do {
    poVar7 = poVar8->next;
    while (iVar4 = stringCompare(poVar7->name,idName), iVar4 != 0) {
      poVar7 = poVar7->next;
    }
  } while ((poVar7 == poVar2) && (bVar9 = poVar8 != poVar3, poVar8 = poVar8->dsc, bVar9));
  return poVar7;
}

Assistant:

object *findProc(void) {
	variable int ret; variable bool cond;
	variable struct object *s; variable struct object *obj; variable struct object *x;
	s = NULL; obj = NULL; x = NULL; cond = true;
	s = topScope;
	stringCopy(idName,guard->name);
	while (cond == true) {
		x=s->next;
		ret = stringCompare(x->name,idName);	
		while (ret != 0) {
			x = x->next;
			ret = stringCompare(x->name,idName);
		}
		if ((x != guard) || (s == universe)) {
			cond = false;
		}
		obj = x;
		s = s->dsc;
	}
	return obj;
}